

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection.h
# Opt level: O2

void __thiscall
google::protobuf::internal::RepeatedFieldAccessor::Add<std::__cxx11::string,std::__cxx11::string>
          (RepeatedFieldAccessor *this,Field *data,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value)

{
  ActualType tmp;
  string asStack_38 [32];
  
  std::__cxx11::string::string(asStack_38,(string *)value);
  (*this->_vptr_RepeatedFieldAccessor[7])(this,data,asStack_38);
  std::__cxx11::string::~string(asStack_38);
  return;
}

Assistant:

void Add(Field* data, const ValueType& value) const {
    typedef typename RefTypeTraits<T>::AccessorValueType ActualType;
    // In this RepeatedFieldAccessor interface we pass/return data using
    // raw pointers. Type of the data these raw pointers point to should
    // be ActualType. Here we have a ValueType object and want a ActualType
    // pointer. We can't cast a ValueType pointer to an ActualType pointer
    // directly because their type might be different (for enums ValueType
    // may be a generated enum type while ActualType is int32). To be safe
    // we make a copy to get a temporary ActualType object and use it.
    ActualType tmp = static_cast<ActualType>(value);
    Add(data, static_cast<const Value*>(&tmp));
  }